

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

int Wln_RetCheckBackward(Wln_Ret_t *p,Vec_Int_t *vSet)

{
  int iVar1;
  int local_24;
  int iObj;
  int i;
  Vec_Int_t *vSet_local;
  Wln_Ret_t *p_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vSet);
    if (iVar1 <= local_24) {
      return 1;
    }
    iVar1 = Vec_IntEntry(vSet,local_24);
    iVar1 = Wln_RetCheckBackwardOne(p,iVar1);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

int Wln_RetCheckBackward( Wln_Ret_t * p, Vec_Int_t * vSet )
{
    int i, iObj;
    Vec_IntForEachEntry( vSet, iObj, i )
        if ( !Wln_RetCheckBackwardOne( p, iObj ) )
            return 0;
    return 1;
}